

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,float *inner,int numInner,
          float *outer,int numOuter)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  string *extraout_RAX;
  string *psVar4;
  undefined4 in_register_0000000c;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  int wrapLengthParam;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long local_68;
  undefined1 local_60 [32];
  float *local_40;
  _anonymous_namespace_ *local_38;
  _anonymous_namespace_ *local_30;
  
  local_38 = this + (long)(int)inner * 4;
  local_68 = CONCAT44(in_register_0000000c,numInner);
  local_30 = this;
  elemsStr<float_const*>
            ((string *)local_60,(Functional *)&local_30,(float **)&local_38,(float **)0x0,(int)outer
             ,numOuter);
  wrapLengthParam = 7;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x1c3c30b);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_b8 = *puVar6;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar6;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_40 = (float *)(CONCAT44(in_register_0000000c,numInner) + (long)(int)outer * 4);
  elemsStr<float_const*>
            (&local_a8,(Functional *)&local_68,&local_40,(float **)0x0,wrapLengthParam,numOuter);
  uVar7 = 0xf;
  if (local_c8 != &local_b8) {
    uVar7 = local_b8;
  }
  if (uVar7 < local_a8._M_string_length + local_c0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar8 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_c0 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_013f7ed9;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
LAB_013f7ed9:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar8 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  psVar4 = (string *)(local_60 + 0x10);
  if ((string *)local_60._0_8_ != psVar4) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

static string tessellationLevelsString (const float* inner, int numInner, const float* outer, int numOuter)
{
	DE_ASSERT(numInner >= 0 && numOuter >= 0);
	return "inner: " + elemsStr(inner, inner+numInner) + ", outer: " + elemsStr(outer, outer+numOuter);
}